

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

pair<HighsImplications::VarBound_*,_bool>
HighsHashTree<int,_HighsImplications::VarBound>::insert_recurse
          (NodePtr *insertNode,uint64_t hash,int hashPos,
          HighsHashTableEntry<int,_HighsImplications::VarBound> *entry)

{
  int *piVar1;
  char *pcVar2;
  byte bVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  InnerLeaf<1> *this;
  ValueType *pVVar9;
  int iVar8;
  ulong *puVar10;
  undefined8 *puVar11;
  sbyte sVar12;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar14;
  uint uVar13;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 *puVar15;
  int i;
  long lVar16;
  ulong uVar17;
  Entry *pEVar18;
  VarBound *pVVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  InnerLeaf<4> *this_00;
  BranchNode *branch;
  array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL> *paVar23;
  pair<HighsImplications::VarBound_*,_bool> pVar24;
  pair<HighsImplications::VarBound_*,_bool> pVar25;
  pair<HighsImplications::VarBound_*,_bool> pVar26;
  array<unsigned_char,_55UL> sizes;
  undefined8 local_70;
  byte local_68 [56];
  
  uVar17 = insertNode->ptrAndType;
  switch((uint)uVar17 & 7) {
  case 0:
    if (hashPos != 9) {
      this = (InnerLeaf<1> *)operator_new(0xd8);
      (this->occupation).occupation = 0;
      this->size = 0;
      (this->hashes)._M_elems[0] = 0;
      insertNode->ptrAndType = (ulong)this | 2;
      pVar24 = InnerLeaf<1>::insert_entry(this,hash,hashPos,entry);
      return pVar24;
    }
    puVar11 = (undefined8 *)operator_new(0x28);
    *puVar11 = 0;
    dVar4 = (entry->value_).coef;
    puVar11[1] = *(undefined8 *)entry;
    puVar11[2] = dVar4;
    puVar11[3] = (entry->value_).constant;
    *(undefined4 *)(puVar11 + 4) = 1;
    insertNode->ptrAndType = (ulong)puVar11 | 1;
    uVar14 = extraout_RDX;
    goto LAB_002a624d;
  case 1:
    puVar11 = (undefined8 *)(uVar17 & 0xfffffffffffffff8);
    do {
      puVar15 = puVar11;
      if (*(int *)(puVar15 + 1) == entry->key_) {
        uVar14 = 0;
        goto LAB_002a6369;
      }
      puVar11 = (undefined8 *)*puVar15;
    } while ((undefined8 *)*puVar15 != (undefined8 *)0x0);
    puVar11 = (undefined8 *)operator_new(0x20);
    *puVar11 = 0;
    dVar4 = (entry->value_).coef;
    puVar11[1] = *(undefined8 *)entry;
    puVar11[2] = dVar4;
    puVar11[3] = (entry->value_).constant;
    *puVar15 = puVar11;
    piVar1 = (int *)((undefined8 *)(uVar17 & 0xfffffffffffffff8) + 4);
    *piVar1 = *piVar1 + 1;
    uVar14 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
    puVar15 = puVar11;
LAB_002a6369:
    pVar25._8_8_ = uVar14;
    pVar25.first = (VarBound *)(puVar15 + 2);
    break;
  case 2:
    pVar25 = insert_into_leaf<1>(insertNode,(InnerLeaf<1> *)(uVar17 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 3:
    pVar25 = insert_into_leaf<2>(insertNode,(InnerLeaf<2> *)(uVar17 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 4:
    pVar25 = insert_into_leaf<3>(insertNode,(InnerLeaf<3> *)(uVar17 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 5:
    this_00 = (InnerLeaf<4> *)(uVar17 & 0xfffffffffffffff8);
    if (this_00->size < 0x36) {
      pVar24 = InnerLeaf<4>::insert_entry(this_00,hash,hashPos,entry);
      return pVar24;
    }
    pVVar9 = InnerLeaf<4>::find_entry(this_00,hash,hashPos,&entry->key_);
    if (pVVar9 != (ValueType *)0x0) {
      pVar24._8_8_ = 0;
      pVar24.first = pVVar9;
      return pVar24;
    }
    uVar7 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
    uVar17 = (this_00->occupation).occupation | 1L << (ulong)uVar7;
    lVar16 = POPCOUNT(uVar17);
    puVar10 = (ulong *)operator_new((lVar16 * 8 + 0x7fffffff8U & 0x7fffffff8) + 0x4f &
                                    0xffffffffffffffc0);
    insertNode->ptrAndType = (ulong)puVar10 | 6;
    *puVar10 = uVar17;
    iVar21 = hashPos + 1;
    uVar13 = (uint)lVar16;
    sVar12 = (sbyte)uVar7;
    if (iVar21 != 9) {
      if (uVar13 < 2) {
        insertNode = (NodePtr *)(puVar10 + 1);
        puVar10[1] = (ulong)this_00 | 5;
        InnerLeaf<4>::rehash(this_00,iVar21);
      }
      else {
        uVar7 = this_00->size;
        iVar8 = (uVar7 - uVar13) + 2;
        if (iVar8 < 7) {
          lVar22 = 0;
          local_70 = hash;
          do {
            puVar11 = (undefined8 *)operator_new(0xd8);
            *puVar11 = 0;
            *(undefined4 *)(puVar11 + 1) = 0;
            puVar11[2] = 0;
            puVar10[lVar22 + 1] = (ulong)puVar11 | 2;
            lVar22 = lVar22 + 1;
          } while (lVar16 != lVar22);
          if (0 < (int)uVar7) {
            pEVar18 = (this_00->entries)._M_elems;
            lVar16 = 0;
            do {
              InnerLeaf<1>::insert_entry
                        ((InnerLeaf<1> *)
                         (puVar10[POPCOUNT(uVar17 >> ((byte)((uint)(this_00->hashes)._M_elems
                                                                   [lVar16] >> 10) & 0x3f))] &
                         0xfffffffffffffff8),
                         (ulong)(uint)pEVar18->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                         0x20 ^ (ulong)(uint)pEVar18->key_ * -0x75e7c76a1153eaca +
                                0x1da24fc66dd63e32,iVar21,pEVar18);
              lVar16 = lVar16 + 1;
              pEVar18 = pEVar18 + 1;
            } while (lVar16 < this_00->size);
          }
          operator_delete(this_00);
          hash = local_70;
          pVar26 = InnerLeaf<1>::insert_entry
                             ((InnerLeaf<1> *)
                              (puVar10[POPCOUNT(uVar17 >> sVar12)] & 0xfffffffffffffff8),local_70,
                              iVar21,entry);
          iVar21 = hashPos;
        }
        else {
          local_68[0x20] = 0;
          local_68[0x21] = 0;
          local_68[0x22] = 0;
          local_68[0x23] = 0;
          local_68[0x24] = 0;
          local_68[0x25] = 0;
          local_68[0x26] = 0;
          local_68[0x27] = 0;
          local_68[0x28] = 0;
          local_68[0x29] = 0;
          local_68[0x2a] = 0;
          local_68[0x2b] = 0;
          local_68[0x2c] = 0;
          local_68[0x2d] = 0;
          local_68[0x2e] = 0;
          local_68[0x10] = 0;
          local_68[0x11] = 0;
          local_68[0x12] = 0;
          local_68[0x13] = 0;
          local_68[0x14] = 0;
          local_68[0x15] = 0;
          local_68[0x16] = 0;
          local_68[0x17] = 0;
          local_68[0x18] = 0;
          local_68[0x19] = 0;
          local_68[0x1a] = 0;
          local_68[0x1b] = 0;
          local_68[0x1c] = 0;
          local_68[0x1d] = 0;
          local_68[0x1e] = 0;
          local_68[0x1f] = 0;
          local_68[0] = 0;
          local_68[1] = 0;
          local_68[2] = 0;
          local_68[3] = 0;
          local_68[4] = 0;
          local_68[5] = 0;
          local_68[6] = 0;
          local_68[7] = 0;
          local_68[8] = 0;
          local_68[9] = 0;
          local_68[10] = 0;
          local_68[0xb] = 0;
          local_68[0xc] = 0;
          local_68[0xd] = 0;
          local_68[0xe] = 0;
          local_68[0xf] = 0;
          local_68[0x2f] = 0;
          local_68[0x30] = 0;
          local_68[0x31] = 0;
          local_68[0x32] = 0;
          local_68[0x33] = 0;
          local_68[0x34] = 0;
          local_68[0x35] = 0;
          local_68[0x36] = 0;
          pcVar2 = (char *)((long)&local_70 + POPCOUNT(uVar17 >> sVar12) + 7);
          *pcVar2 = *pcVar2 + '\x01';
          if (0 < (int)uVar7) {
            uVar20 = 0;
            do {
              pcVar2 = (char *)((long)&local_70 +
                               POPCOUNT(uVar17 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar20]
                                                         >> 10) & 0x3f)) + 7);
              *pcVar2 = *pcVar2 + '\x01';
              uVar20 = uVar20 + 1;
            } while (uVar7 != uVar20);
          }
          pVVar19 = (VarBound *)0x0;
          do {
            switch(local_68[(long)pVVar19] + 9 >> 4) {
            case 0:
              puVar11 = (undefined8 *)operator_new(0xd8);
              uVar20 = 2;
              break;
            case 1:
              puVar11 = (undefined8 *)operator_new(0x2d8);
              uVar20 = 3;
              break;
            case 2:
              puVar11 = (undefined8 *)operator_new(0x4d8);
              uVar20 = 4;
              break;
            case 3:
              puVar11 = (undefined8 *)operator_new(0x6d8);
              uVar20 = 5;
              break;
            default:
              goto switchD_002a6832_default;
            }
            *puVar11 = 0;
            *(undefined4 *)(puVar11 + 1) = 0;
            puVar11[2] = 0;
            puVar10[(long)((long)&pVVar19->coef + 1)] = uVar20 | (ulong)puVar11;
switchD_002a6832_default:
            pVVar19 = (VarBound *)((long)&pVVar19->coef + 1);
          } while ((VarBound *)(ulong)(uVar13 + (uVar13 == 0)) != pVVar19);
          if (0 < (int)uVar7) {
            pEVar18 = (this_00->entries)._M_elems;
            pVVar19 = (VarBound *)0x0;
            do {
              uVar20 = puVar10[POPCOUNT(uVar17 >> ((byte)((uint)(this_00->hashes)._M_elems
                                                                [(long)pVVar19] >> 10) & 0x3f))];
              switch((uint)uVar20 & 7) {
              case 2:
                InnerLeaf<1>::insert_entry
                          ((InnerLeaf<1> *)(uVar20 & 0xfffffffffffffff8),
                           (ulong)(uint)pEVar18->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                           0x20 ^ (ulong)(uint)pEVar18->key_ * -0x75e7c76a1153eaca +
                                  0x1da24fc66dd63e32,iVar21,pEVar18);
                break;
              case 3:
                InnerLeaf<2>::insert_entry
                          ((InnerLeaf<2> *)(uVar20 & 0xfffffffffffffff8),
                           (ulong)(uint)pEVar18->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                           0x20 ^ (ulong)(uint)pEVar18->key_ * -0x75e7c76a1153eaca +
                                  0x1da24fc66dd63e32,iVar21,pEVar18);
                break;
              case 4:
                InnerLeaf<3>::insert_entry
                          ((InnerLeaf<3> *)(uVar20 & 0xfffffffffffffff8),
                           (ulong)(uint)pEVar18->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                           0x20 ^ (ulong)(uint)pEVar18->key_ * -0x75e7c76a1153eaca +
                                  0x1da24fc66dd63e32,iVar21,pEVar18);
                break;
              case 5:
                InnerLeaf<4>::insert_entry
                          ((InnerLeaf<4> *)(uVar20 & 0xfffffffffffffff8),
                           (ulong)(uint)pEVar18->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                           0x20 ^ (ulong)(uint)pEVar18->key_ * -0x75e7c76a1153eaca +
                                  0x1da24fc66dd63e32,iVar21,pEVar18);
              }
              pVVar19 = (VarBound *)((long)&pVVar19->coef + 1);
              pEVar18 = pEVar18 + 1;
            } while ((long)pVVar19 < (long)this_00->size);
          }
          operator_delete(this_00);
          pVar26._8_8_ = extraout_RDX_03;
          pVar26.first = pVVar19;
          insertNode = (NodePtr *)(puVar10 + POPCOUNT(uVar17 >> sVar12));
        }
        if (iVar8 < 7) {
          return pVar26;
        }
      }
      goto LAB_002a6401;
    }
    memset(puVar10 + 1,0,(ulong)(uVar13 << 3));
    iVar21 = this_00->size;
    if (0 < iVar21) {
      paVar23 = &this_00->entries;
      lVar16 = 0;
      do {
        lVar22 = POPCOUNT(uVar17 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar16] >> 10) & 0x3f))
        ;
        if ((puVar10[lVar22] & 7) == 0) {
          puVar11 = (undefined8 *)operator_new(0x28);
          *puVar11 = 0;
          dVar4 = paVar23->_M_elems[0].value_.coef;
          puVar11[1] = *(undefined8 *)paVar23->_M_elems;
          puVar11[2] = dVar4;
          puVar11[3] = paVar23->_M_elems[0].value_.constant;
          *(undefined4 *)(puVar11 + 4) = 1;
          puVar10[lVar22] = (ulong)puVar11 | 1;
        }
        else {
          puVar15 = (undefined8 *)(puVar10[lVar22] & 0xfffffffffffffff8);
          puVar11 = (undefined8 *)operator_new(0x20);
          uVar14 = *puVar15;
          uVar5 = puVar15[1];
          uVar6 = puVar15[3];
          puVar11[2] = puVar15[2];
          puVar11[3] = uVar6;
          *puVar11 = uVar14;
          puVar11[1] = uVar5;
          *puVar15 = puVar11;
          puVar15[3] = paVar23->_M_elems[0].value_.constant;
          dVar4 = paVar23->_M_elems[0].value_.coef;
          puVar15[1] = *(undefined8 *)paVar23->_M_elems;
          puVar15[2] = dVar4;
          *(int *)(puVar15 + 4) = *(int *)(puVar15 + 4) + 1;
          iVar21 = this_00->size;
        }
        lVar16 = lVar16 + 1;
        paVar23 = (array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL> *)
                  (paVar23->_M_elems + 1);
      } while (lVar16 < iVar21);
    }
    operator_delete(this_00);
    if ((puVar10[POPCOUNT(uVar17 >> sVar12)] & 7) == 0) {
      puVar11 = (undefined8 *)operator_new(0x28);
      *puVar11 = 0;
      dVar4 = (entry->value_).coef;
      puVar11[1] = *(undefined8 *)entry;
      puVar11[2] = dVar4;
      puVar11[3] = (entry->value_).constant;
      *(undefined4 *)(puVar11 + 4) = 1;
      puVar10[POPCOUNT(uVar17 >> sVar12)] = (ulong)puVar11 | 1;
      uVar14 = extraout_RDX_02;
    }
    else {
      puVar11 = (undefined8 *)(puVar10[POPCOUNT(uVar17 >> sVar12)] & 0xfffffffffffffff8);
      puVar15 = (undefined8 *)operator_new(0x20);
      uVar14 = *puVar11;
      uVar5 = puVar11[1];
      uVar6 = puVar11[3];
      puVar15[2] = puVar11[2];
      puVar15[3] = uVar6;
      *puVar15 = uVar14;
      puVar15[1] = uVar5;
      *puVar11 = puVar15;
      puVar11[3] = (entry->value_).constant;
      dVar4 = (entry->value_).coef;
      puVar11[1] = *(undefined8 *)entry;
      puVar11[2] = dVar4;
      *(int *)(puVar11 + 4) = *(int *)(puVar11 + 4) + 1;
      uVar14 = extraout_RDX_01;
    }
LAB_002a624d:
    pVar25._9_7_ = (int7)((ulong)uVar14 >> 8);
    pVar25.second = true;
    pVar25.first = (VarBound *)(puVar11 + 2);
    break;
  case 6:
    uVar20 = hash >> ((char)hashPos * -6 + 0x3aU & 0x3f);
    branch = (BranchNode *)(uVar17 & 0xfffffffffffffff8);
    uVar17 = (branch->occupation).occupation;
    bVar3 = (byte)uVar20;
    lVar16 = POPCOUNT(uVar17 >> (bVar3 & 0x3f));
    if ((uVar17 >> (uVar20 & 0x3f) & 1) == 0) {
      branch = addChildToBranchNode(branch,bVar3 & 0x3f,(int)lVar16);
      branch->child[lVar16].ptrAndType = 0;
      (branch->occupation).occupation = (branch->occupation).occupation | 1L << (bVar3 & 0x3f);
    }
    else {
      lVar16 = lVar16 + -1;
    }
    insertNode->ptrAndType = (ulong)branch | 6;
    iVar21 = hashPos + 1;
    insertNode = branch->child + lVar16;
    goto LAB_002a6401;
  case 7:
    iVar21 = hashPos;
LAB_002a6401:
    pVar25 = insert_recurse(insertNode,hash,iVar21,entry);
  }
  return pVar25;
}

Assistant:

static std::pair<ValueType*, bool> insert_recurse(
      NodePtr* insertNode, uint64_t hash, int hashPos,
      HighsHashTableEntry<K, V>& entry) {
    switch (insertNode->getType()) {
      case kEmpty: {
        if (hashPos == kMaxDepth) {
          ListLeaf* leaf = new ListLeaf(std::move(entry));
          *insertNode = leaf;
          return std::make_pair(&leaf->first.entry.value(), true);
        } else {
          InnerLeaf<1>* leaf = new InnerLeaf<1>;
          *insertNode = leaf;
          return leaf->insert_entry(hash, hashPos, entry);
        }
      }
      case kListLeaf: {
        ListLeaf* leaf = insertNode->getListLeaf();
        ListNode* iter = &leaf->first;
        while (true) {
          // check for existing key
          if (iter->entry.key() == entry.key())
            return std::make_pair(&iter->entry.value(), false);

          if (iter->next == nullptr) {
            // reached the end of the list and key is not duplicate, so insert
            iter->next = new ListNode(std::move(entry));
            ++leaf->count;
            return std::make_pair(&iter->next->entry.value(), true);
          }
          iter = iter->next;
        }

        break;
      }
      case kInnerLeafSizeClass1:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass1(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass2:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass2(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass3:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass3(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = insertNode->getInnerLeafSizeClass4();
        if (leaf->size < InnerLeaf<4>::capacity())
          return leaf->insert_entry(hash, hashPos, entry);

        auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
        if (existingEntry) return std::make_pair(existingEntry, false);
        Occupation occupation = leaf->occupation;

        uint8_t hashChunk = get_hash_chunk(hash, hashPos);
        occupation.set(hashChunk);

        int branchSize = occupation.num_set();

        BranchNode* branch = createBranchingNode(branchSize);
        *insertNode = branch;
        branch->occupation = occupation;

        if (hashPos + 1 == kMaxDepth) {
          for (int i = 0; i < branchSize; ++i) branch->child[i] = nullptr;

          for (int i = 0; i < leaf->size; ++i) {
            int pos =
                occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                1;
            if (branch->child[pos].getType() == kEmpty)
              branch->child[pos] = new ListLeaf(std::move(leaf->entries[i]));
            else {
              ListLeaf* listLeaf = branch->child[pos].getListLeaf();
              ListNode* newNode = new ListNode(std::move(listLeaf->first));
              listLeaf->first.next = newNode;
              listLeaf->first.entry = std::move(leaf->entries[i]);
              ++listLeaf->count;
            }
          }

          delete leaf;

          ListLeaf* listLeaf;

          int pos = occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
          if (branch->child[pos].getType() == kEmpty) {
            listLeaf = new ListLeaf(std::move(entry));
            branch->child[pos] = listLeaf;
          } else {
            listLeaf = branch->child[pos].getListLeaf();
            ListNode* newNode = new ListNode(std::move(listLeaf->first));
            listLeaf->first.next = newNode;
            listLeaf->first.entry = std::move(entry);
            ++listLeaf->count;
          }

          return std::make_pair(&listLeaf->first.entry.value(), true);
        }

        if (branchSize > 1) {
          // maxsize in one bucket = number of items - (num buckets-1)
          // since each bucket has at least 1 item the largest one can only
          // have all remaining ones After adding the item: If it does not
          // collide
          int maxEntriesPerLeaf = 2 + leaf->size - branchSize;

          if (maxEntriesPerLeaf <= InnerLeaf<1>::capacity()) {
            // all items can go into the smallest leaf size
            for (int i = 0; i < branchSize; ++i)
              branch->child[i] = new InnerLeaf<1>;

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                  compute_hash(leaf->entries[i].key()), hashPos + 1,
                  leaf->entries[i]);
            }

            delete leaf;

            int pos =
                occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
            return branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                hash, hashPos + 1, entry);
          } else {
            // there are many collisions, determine the exact sizes first
            std::array<uint8_t, InnerLeaf<4>::capacity() + 1> sizes = {};
            sizes[occupation.num_set_until(hashChunk) - 1] += 1;
            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              sizes[pos] += 1;
            }

            for (int i = 0; i < branchSize; ++i) {
              switch (entries_to_size_class(sizes[i])) {
                case 1:
                  branch->child[i] = new InnerLeaf<1>;
                  break;
                case 2:
                  branch->child[i] = new InnerLeaf<2>;
                  break;
                case 3:
                  branch->child[i] = new InnerLeaf<3>;
                  break;
                case 4:
                  branch->child[i] = new InnerLeaf<4>;
                  break;
                default:
                  // Unexpected result from 'entries_to_size_class'
                  assert(false);
              }
            }

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;

              switch (branch->child[pos].getType()) {
                case kInnerLeafSizeClass1:
                  branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass2:
                  branch->child[pos].getInnerLeafSizeClass2()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass3:
                  branch->child[pos].getInnerLeafSizeClass3()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass4:
                  branch->child[pos].getInnerLeafSizeClass4()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                default:
                  break;
              }
            }
          }

          delete leaf;

          int pos = occupation.num_set_until(hashChunk) - 1;
          insertNode = &branch->child[pos];
          ++hashPos;
        } else {
          // extremely unlikely that the new branch node only gets one
          // child in that case create it and defer the insertion into
          // the next depth
          branch->child[0] = leaf;
          insertNode = &branch->child[0];
          ++hashPos;
          leaf->rehash(hashPos);
        }

        break;
      }
      case kBranchNode: {
        BranchNode* branch = insertNode->getBranchNode();

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos));

        if (branch->occupation.test(get_hash_chunk(hash, hashPos))) {
          --location;
        } else {
          branch = addChildToBranchNode(branch, get_hash_chunk(hash, hashPos),
                                        location);

          branch->child[location] = nullptr;
          branch->occupation.set(get_hash_chunk(hash, hashPos));
        }

        *insertNode = branch;
        insertNode = &branch->child[location];
        ++hashPos;
      }
    }

    return insert_recurse(insertNode, hash, hashPos, entry);
  }